

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

int __thiscall QTreeViewPrivate::itemDecorationAt(QTreeViewPrivate *this,QPoint *pos)

{
  long lVar1;
  QTreeView *this_00;
  Data *pDVar2;
  QTreeViewItem *pQVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  long in_FS_OFFSET;
  QModelIndex local_60;
  QModelIndex ret;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  QAbstractItemViewPrivate::executePostedLayout(&this->super_QAbstractItemViewPrivate);
  pDVar2 = (this->spanningIndexes).q_hash.d;
  if ((pDVar2 != (Data *)0x0) && (pDVar2->size != 0)) {
    ret.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    ret._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ret.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)&(this_00->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame
                           .super_QWidget + 0x1f0))(&ret,this_00,pos);
    iVar10 = ret.r;
    if ((-1 < ret.r) && ((-1 < (long)ret._0_8_ && (ret.m.ptr != (QAbstractItemModel *)0x0)))) {
      QModelIndex::parent(&local_60,&ret);
      bVar4 = QTreeView::isFirstColumnSpanned(this_00,iVar10,&local_60);
      iVar10 = 0;
      if (bVar4) goto LAB_0054145a;
    }
  }
  iVar10 = QHeaderView::logicalIndexAt(this->header,(pos->xp).m_i);
LAB_0054145a:
  iVar6 = logicalIndexForTree(this);
  if (iVar6 == iVar10) {
    uVar7 = itemAtCoordinate(this,(pos->yp).m_i);
    if (((int)uVar7 < 0) || (uVar9 = (ulong)uVar7, (ulong)(this->viewItems).d.size <= uVar9)) {
      ret.r = -1;
      ret.c = -1;
      ret.i = 0;
      ret.m.ptr = (QAbstractItemModel *)0x0;
    }
    else {
      pQVar3 = (this->viewItems).d.ptr;
      ret.m.ptr = pQVar3[uVar9].index.m.ptr;
      pQVar3 = pQVar3 + uVar9;
      ret.r = (pQVar3->index).r;
      ret.c = (pQVar3->index).c;
      ret.i = (pQVar3->index).i;
    }
    local_60._0_16_ = itemDecorationRect(this,&ret);
    cVar5 = QRect::contains((QPoint *)&local_60,SUB81(pos,0));
    uVar8 = 0xffffffff;
    if (cVar5 != '\0') {
      uVar8 = uVar7;
    }
  }
  else {
    uVar8 = 0xffffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar8;
  }
  __stack_chk_fail();
}

Assistant:

int QTreeViewPrivate::itemDecorationAt(const QPoint &pos) const
{
    Q_Q(const QTreeView);
    executePostedLayout();
    bool spanned = false;
    if (!spanningIndexes.isEmpty()) {
        const QModelIndex index = q->indexAt(pos);
        if (index.isValid())
            spanned = q->isFirstColumnSpanned(index.row(), index.parent());
    }
    const int column = spanned ? 0 : header->logicalIndexAt(pos.x());
    if (!isTreePosition(column))
        return -1; // no logical index at x

    int viewItemIndex = itemAtCoordinate(pos.y());
    QRect returning = itemDecorationRect(modelIndex(viewItemIndex));
    if (!returning.contains(pos))
        return -1;

    return viewItemIndex;
}